

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Descriptor *type;
  MessageLite *pMVar3;
  ostream *poVar4;
  uint8_t *ptr;
  long lVar5;
  char *pcVar6;
  string_view name;
  int size;
  ErrorPrinter error_collector;
  Parser parser;
  FileOutputStream out;
  FileInputStream in;
  DynamicMessageFactory dynamic_factory;
  uint local_194;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  uint8_t local_170 [16];
  FileOutputStream *local_160;
  undefined2 local_158;
  bool local_156;
  bool local_155;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  int64_t local_148;
  Parser local_140;
  FileOutputStream local_110;
  FileInputStream local_c8;
  DynamicMessageFactory local_70;
  
  name._M_str = (this->codec_type_)._M_dataplus._M_p;
  name._M_len = (this->codec_type_)._M_string_length;
  type = DescriptorPool::FindMessageTypeByName(pool,name);
  if (type == (Descriptor *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Type not defined: ",0x12);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->codec_type_)._M_dataplus._M_p,
                        (this->codec_type_)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return false;
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_70,pool);
  pMVar3 = &DynamicMessageFactory::GetPrototype(&local_70,type)->super_MessageLite;
  pMVar3 = MessageLite::New(pMVar3,(Arena *)0x0);
  io::FileInputStream::FileInputStream(&local_c8,0,-1);
  io::FileOutputStream::FileOutputStream(&local_110,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    local_180._8_4_ = this->error_format_;
    local_190._0_8_ = &PTR__ErrorPrinter_00589b40;
    local_190._8_8_ = &PTR__ErrorPrinter_00589b90;
    local_180._M_allocated_capacity = (size_type)&DAT_00589bc0;
    local_170[0] = '\0';
    local_170[1] = '\0';
    local_170[2] = '\0';
    local_170[3] = '\0';
    local_170[4] = '\0';
    local_170[5] = '\0';
    local_170[6] = '\0';
    local_170[7] = '\0';
    local_170[8] = '\0';
    local_170[9] = '\0';
    TextFormat::Parser::Parser(&local_140);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_190 + 8);
    local_140.allow_partial_ = true;
    local_140.error_collector_ = (ErrorCollector *)paVar1;
    bVar2 = TextFormat::Parser::Parse
                      (&local_140,&local_c8.super_ZeroCopyInputStream,(Message *)pMVar3);
    if (bVar2) {
      TextFormat::Parser::~Parser(&local_140);
      DescriptorPool::ErrorCollector::~ErrorCollector
                ((ErrorCollector *)&local_180._M_allocated_capacity);
      io::ErrorCollector::~ErrorCollector((ErrorCollector *)&paVar1->_M_allocated_capacity);
      MultiFileErrorCollector::~MultiFileErrorCollector((MultiFileErrorCollector *)local_190);
LAB_001d75c9:
      bVar2 = MessageLite::IsInitialized(pMVar3);
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning:  Input message is missing required fields:  ",
                   0x35);
        Message::InitializationErrorString_abi_cxx11_((string *)local_190,(Message *)pMVar3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_190._0_8_,local_190._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._0_8_ != &local_180) {
          operator_delete((void *)local_190._0_8_,(ulong)(local_180._M_allocated_capacity + 1));
        }
      }
      if (this->mode_ == MODE_ENCODE) {
        local_156 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
        local_160 = &local_110;
        local_158._0_1_ = false;
        local_158._1_1_ = false;
        local_155 = false;
        local_190._0_8_ = &local_180;
        local_190._8_8_ = &local_180;
        local_150 = &local_180;
        local_148 = io::CopyingOutputStreamAdaptor::ByteCount
                              (&local_160->super_CopyingOutputStreamAdaptor);
        bVar2 = io::CopyingOutputStreamAdaptor::Next
                          (&local_110.super_CopyingOutputStreamAdaptor,&local_140.error_collector_,
                           (int *)&local_194);
        if (bVar2 && 0 < (int)local_194) {
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_140.error_collector_ + -2);
          if ((int)local_194 < 0x11) {
            paVar1 = &local_180;
          }
          local_190._0_8_ = (long)paVar1 + (ulong)local_194;
          local_190._8_8_ = local_140.error_collector_;
          local_150 = &local_180;
          if (0x10 < (int)local_194) {
            local_190._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140.error_collector_;
          }
        }
        local_156 = this->deterministic_output_;
        bVar2 = MessageLite::SerializePartialToCodedStream(pMVar3,(CodedOutputStream *)local_190);
        if (bVar2) {
          io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_190);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"output: I/O error.",0x12);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
          std::ostream::put('\x18');
          std::ostream::flush();
          io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_190);
          if (!bVar2) goto LAB_001d7789;
        }
      }
      else {
        bVar2 = TextFormat::Print((Message *)pMVar3,(ZeroCopyOutputStream *)&local_110);
        if (!bVar2) {
          lVar5 = 0x12;
          pcVar6 = "output: I/O error.";
          goto LAB_001d774f;
        }
      }
      bVar2 = true;
      goto LAB_001d77e5;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to parse input.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    TextFormat::Parser::~Parser(&local_140);
    DescriptorPool::ErrorCollector::~ErrorCollector
              ((ErrorCollector *)&local_180._M_allocated_capacity);
    io::ErrorCollector::~ErrorCollector((ErrorCollector *)&paVar1->_M_allocated_capacity);
    MultiFileErrorCollector::~MultiFileErrorCollector((MultiFileErrorCollector *)local_190);
    if (bVar2) goto LAB_001d75c9;
  }
  else {
    bVar2 = MessageLite::ParsePartialFromZeroCopyStream(pMVar3,&local_c8.super_ZeroCopyInputStream);
    if (bVar2) goto LAB_001d75c9;
    lVar5 = 0x16;
    pcVar6 = "Failed to parse input.";
LAB_001d774f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
  }
LAB_001d7789:
  bVar2 = false;
LAB_001d77e5:
  io::FileOutputStream::~FileOutputStream(&local_110);
  io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&local_c8.impl_);
  io::FileInputStream::CopyingFileInputStream::~CopyingFileInputStream(&local_c8.copying_input_);
  if (pMVar3 != (MessageLite *)0x0) {
    (*pMVar3->_vptr_MessageLite[1])(pMVar3);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&local_70);
  return bVar2;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == nullptr) {
    std::cerr << "Type not defined: " << codec_type_ << std::endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  std::unique_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    std::cerr << "warning:  Input message is missing required fields:  "
              << message->InitializationErrorString() << std::endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    io::CodedOutputStream coded_out(&out);
    coded_out.SetSerializationDeterministic(deterministic_output_);
    if (!message->SerializePartialToCodedStream(&coded_out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  }

  return true;
}